

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::CreateSound(CGameContext *this,vec2 Pos,int Sound,int64 Mask)

{
  undefined8 *puVar1;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_18;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_14;
  
  if (-1 < Sound) {
    puVar1 = (undefined8 *)CEventHandler::Create(&this->m_Events,0x15,0xc,Mask);
    local_18 = Pos.field_0;
    aStack_14 = Pos.field_1;
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = CONCAT44((int)aStack_14.y,(int)local_18.x);
      *(int *)(puVar1 + 1) = Sound;
    }
  }
  return;
}

Assistant:

void CGameContext::CreateSound(vec2 Pos, int Sound, int64 Mask)
{
	if (Sound < 0)
		return;

	// create a sound
	CNetEvent_SoundWorld *pEvent = (CNetEvent_SoundWorld *)m_Events.Create(NETEVENTTYPE_SOUNDWORLD, sizeof(CNetEvent_SoundWorld), Mask);
	if(pEvent)
	{
		pEvent->m_X = (int)Pos.x;
		pEvent->m_Y = (int)Pos.y;
		pEvent->m_SoundID = Sound;
	}
}